

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
getConstraintsJacobianInfo
          (MultipleShootingTranscription *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementRows,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementColumns)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar1 = this->m_prepared;
  if (bVar1 == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getConstraintsInfo",
               "First you need to call the prepare method");
  }
  else {
    if ((long)(nonZeroElementRows->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(nonZeroElementRows->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3 != this->m_jacobianNonZeros) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (nonZeroElementRows,this->m_jacobianNonZeros & 0xffffffff);
    }
    if ((long)(nonZeroElementColumns->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(nonZeroElementColumns->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != this->m_jacobianNonZeros) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (nonZeroElementColumns,this->m_jacobianNonZeros & 0xffffffff);
    }
    if (this->m_jacobianNonZeros != 0) {
      puVar2 = (this->m_jacobianNZRows).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->m_jacobianNZCols).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (nonZeroElementRows->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (nonZeroElementColumns->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 1;
      uVar7 = 0;
      do {
        puVar4[uVar7] = puVar2[uVar7];
        puVar5[uVar7] = puVar3[uVar7];
        uVar7 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar7 < this->m_jacobianNonZeros);
    }
  }
  return bVar1;
}

Assistant:

virtual bool getConstraintsJacobianInfo(std::vector<size_t>& nonZeroElementRows, std::vector<size_t>& nonZeroElementColumns) override {

                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "getConstraintsInfo", "First you need to call the prepare method");
                    return false;
                }

                if (nonZeroElementRows.size() != m_jacobianNonZeros) {
                    nonZeroElementRows.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }

                if (nonZeroElementColumns.size() != m_jacobianNonZeros) {
                    nonZeroElementColumns.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }


                for (unsigned int i = 0; i < m_jacobianNonZeros; ++i){ //not the full vector of nonZeros should be read
                    nonZeroElementRows[i] = m_jacobianNZRows[i];
                    nonZeroElementColumns[i] = m_jacobianNZCols[i];
                }

                return true;
            }